

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_option(nk_command_buffer *out,nk_flags state,nk_style_toggle *style,nk_bool active,
                   nk_rect *label,nk_rect *selector,nk_rect *cursors,char *string,int len,
                   nk_user_font *font)

{
  nk_rect r;
  nk_rect r_00;
  nk_rect r_01;
  nk_rect r_02;
  nk_rect b;
  int in_ECX;
  nk_user_font *in_RDX;
  uint in_ESI;
  undefined8 in_RDI;
  nk_text *in_R8;
  undefined8 in_R9;
  nk_rect nVar1;
  undefined8 unaff_retaddr;
  nk_text text;
  nk_style_item *cursor;
  nk_style_item *background;
  nk_command_buffer *local_60;
  undefined4 in_stack_ffffffffffffffb0;
  nk_color in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  float fVar2;
  nk_query_font_glyph_f *pp_Var3;
  nk_color nVar4;
  nk_user_font *f;
  undefined4 uVar5;
  float a;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar5 = (undefined4)in_R9;
  a = (float)((ulong)in_R9 >> 0x20);
  if ((in_ESI & 0x10) == 0) {
    if ((in_ESI & 0x20) == 0) {
      pp_Var3 = &in_RDX[2].query;
      fVar2 = in_RDX[4].height;
      f = in_RDX;
    }
    else {
      pp_Var3 = (nk_query_font_glyph_f *)&in_RDX[3].width;
      fVar2 = *(float *)&in_RDX[4].width;
      f = (nk_user_font *)&in_RDX->texture;
    }
  }
  else {
    pp_Var3 = (nk_query_font_glyph_f *)&in_RDX[3].width;
    fVar2 = *(float *)&in_RDX[4].field_0xc;
    f = (nk_user_font *)&in_RDX->texture;
  }
  nVar4 = SUB84((ulong)pp_Var3 >> 0x20,0);
  if ((f->userdata).id == 0) {
    r.y = fVar2;
    r.x = (float)in_stack_ffffffffffffffb8;
    r.w = (float)(int)pp_Var3;
    r.h = (float)nVar4;
    nk_fill_circle(local_60,r,in_stack_ffffffffffffffb4);
    nVar1 = nk_shrink_rect(*(nk_rect *)CONCAT44(a,uVar5),in_RDX[5].height);
    local_60 = nVar1._8_8_;
    r_00.y = fVar2;
    r_00.x = (float)in_stack_ffffffffffffffb8;
    r_00.w = (float)(int)pp_Var3;
    r_00.h = (float)((ulong)pp_Var3 >> 0x20);
    nk_fill_circle(local_60,r_00,in_stack_ffffffffffffffb4);
  }
  else {
    nVar1.w = (float)uVar5;
    nVar1._0_8_ = f;
    nVar1.h = a;
    nk_draw_image((nk_command_buffer *)CONCAT44(fVar2,in_stack_ffffffffffffffb8),nVar1,
                  (nk_image *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),nVar4);
  }
  nVar4 = SUB84((ulong)pp_Var3 >> 0x20,0);
  if (in_ECX != 0) {
    if (*(int *)pp_Var3 == 1) {
      r_02.w = (float)uVar5;
      r_02._0_8_ = f;
      r_02.h = a;
      nk_draw_image((nk_command_buffer *)CONCAT44(fVar2,in_stack_ffffffffffffffb8),r_02,
                    (nk_image *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),nVar4)
      ;
    }
    else {
      r_01.y = fVar2;
      r_01.x = (float)in_stack_ffffffffffffffb8;
      r_01.w = (float)(int)pp_Var3;
      r_01.h = (float)nVar4;
      nk_fill_circle(local_60,r_01,in_stack_ffffffffffffffb4);
    }
  }
  b._8_8_ = unaff_retaddr;
  b.x = (float)(int)in_RDI;
  b.y = (float)(int)((ulong)in_RDI >> 0x20);
  nk_widget_text((nk_command_buffer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),b,(char *)in_RDX,
                 in_ECX,in_R8,(nk_flags)a,f);
  return;
}

Assistant:

NK_LIB void
nk_draw_option(struct nk_command_buffer *out,
nk_flags state, const struct nk_style_toggle *style, nk_bool active,
const struct nk_rect *label, const struct nk_rect *selector,
const struct nk_rect *cursors, const char *string, int len,
const struct nk_user_font *font)
{
const struct nk_style_item *background;
const struct nk_style_item *cursor;
struct nk_text text;

/* select correct colors/images */
if (state & NK_WIDGET_STATE_HOVER) {
background = &style->hover;
cursor = &style->cursor_hover;
text.text = style->text_hover;
} else if (state & NK_WIDGET_STATE_ACTIVED) {
background = &style->hover;
cursor = &style->cursor_hover;
text.text = style->text_active;
} else {
background = &style->normal;
cursor = &style->cursor_normal;
text.text = style->text_normal;
}

/* draw background and cursor */
if (background->type == NK_STYLE_ITEM_COLOR) {
nk_fill_circle(out, *selector, style->border_color);
nk_fill_circle(out, nk_shrink_rect(*selector, style->border), background->data.color);
} else nk_draw_image(out, *selector, &background->data.image, nk_white);
if (active) {
if (cursor->type == NK_STYLE_ITEM_IMAGE)
nk_draw_image(out, *cursors, &cursor->data.image, nk_white);
else nk_fill_circle(out, *cursors, cursor->data.color);
}

text.padding.x = 0;
text.padding.y = 0;
text.background = style->text_background;
nk_widget_text(out, *label, string, len, &text, NK_TEXT_LEFT, font);
}